

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

string * __thiscall
cmGlobalGenerator::IndexGeneratorTargetUniquely_abi_cxx11_
          (string *__return_storage_ptr__,cmGlobalGenerator *this,cmGeneratorTarget *gt)

{
  size_t sVar1;
  mapped_type *ppcVar2;
  char *pcVar3;
  allocator local_5b;
  undefined1 local_5a;
  byte local_59;
  ulong uStack_58;
  uchar c;
  size_t i;
  char *b;
  char buf [17];
  size_t sizeof_ptr;
  cmGeneratorTarget *gt_local;
  cmGlobalGenerator *this_local;
  string *id;
  
  sizeof_ptr = (size_t)gt;
  i = (long)&b + 1;
  b._0_1_ = 0x3a;
  gt_local = (cmGeneratorTarget *)this;
  this_local = (cmGlobalGenerator *)__return_storage_ptr__;
  for (uStack_58 = 0; uStack_58 < 8; uStack_58 = uStack_58 + 1) {
    local_59 = *(byte *)((long)&sizeof_ptr + uStack_58);
    pcVar3 = (char *)(i + 1);
    *(char *)i = "0123456789abcdef"[(int)(local_59 & 0xf0) >> 4];
    i = i + 2;
    *pcVar3 = "0123456789abcdef"[(int)(local_59 & 0xf)];
  }
  local_5a = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,(char *)&b,0x11,&local_5b);
  std::allocator<char>::~allocator((allocator<char> *)&local_5b);
  sVar1 = sizeof_ptr;
  ppcVar2 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget_*>_>_>
            ::operator[](&this->GeneratorTargetSearchIndex,__return_storage_ptr__);
  *ppcVar2 = (mapped_type)sVar1;
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalGenerator::IndexGeneratorTargetUniquely(
  cmGeneratorTarget const* gt)
{
  // Use the pointer value to uniquely identify the target instance.
  // Use a ":" prefix to avoid conflict with project-defined targets.
  // We must satisfy cmGeneratorExpression::IsValidTargetName so use no
  // other special characters.
  constexpr size_t sizeof_ptr =
    sizeof(gt); // NOLINT(bugprone-sizeof-expression)
  char buf[1 + sizeof_ptr * 2];
  char* b = buf;
  *b++ = ':';
  for (size_t i = 0; i < sizeof_ptr; ++i) {
    unsigned char const c = reinterpret_cast<unsigned char const*>(&gt)[i];
    *b++ = hexDigits[(c & 0xf0) >> 4];
    *b++ = hexDigits[(c & 0x0f)];
  }
  std::string id(buf, sizeof(buf));
  // We internally index pointers to non-const generator targets
  // but our callers only have pointers to const generator targets.
  // They will give up non-const privileges when looking up anyway.
  this->GeneratorTargetSearchIndex[id] = const_cast<cmGeneratorTarget*>(gt);
  return id;
}